

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O0

void drop_nonterminal_imp_node
               (vector<ImputeNode,_std::allocator<ImputeNode>_> *imputer_tree,
               vector<IsoTree,_std::allocator<IsoTree>_> *trees,
               vector<IsoHPlane,_std::allocator<IsoHPlane>_> *hplanes)

{
  size_type sVar1;
  reference pvVar2;
  reference pvVar3;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *in_RDX;
  vector<IsoTree,_std::allocator<IsoTree>_> *in_RSI;
  vector<ImputeNode,_std::allocator<ImputeNode>_> *in_RDI;
  size_t tr_1;
  size_t tr;
  ulong local_28;
  ulong local_20;
  
  if (in_RSI == (vector<IsoTree,_std::allocator<IsoTree>_> *)0x0) {
    for (local_28 = 0; sVar1 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::size(in_RDX),
        local_28 < sVar1; local_28 = local_28 + 1) {
      pvVar3 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDX,local_28);
      if (pvVar3->hplane_left == 0) {
        std::vector<ImputeNode,_std::allocator<ImputeNode>_>::operator[](in_RDI,local_28);
        std::vector<double,_std::allocator<double>_>::clear
                  ((vector<double,_std::allocator<double>_> *)0x1a9f5d);
        std::vector<ImputeNode,_std::allocator<ImputeNode>_>::operator[](in_RDI,local_28);
        std::vector<double,_std::allocator<double>_>::shrink_to_fit
                  ((vector<double,_std::allocator<double>_> *)0x1a9f78);
      }
      else {
        std::vector<ImputeNode,_std::allocator<ImputeNode>_>::operator[](in_RDI,local_28);
        shrink_impute_node((ImputeNode *)0x1a9f40);
      }
    }
  }
  else {
    for (local_20 = 0; sVar1 = std::vector<IsoTree,_std::allocator<IsoTree>_>::size(in_RSI),
        local_20 < sVar1; local_20 = local_20 + 1) {
      pvVar2 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[](in_RSI,local_20);
      if (pvVar2->tree_left == 0) {
        std::vector<ImputeNode,_std::allocator<ImputeNode>_>::operator[](in_RDI,local_20);
        std::vector<double,_std::allocator<double>_>::clear
                  ((vector<double,_std::allocator<double>_> *)0x1a9eb3);
        std::vector<ImputeNode,_std::allocator<ImputeNode>_>::operator[](in_RDI,local_20);
        std::vector<double,_std::allocator<double>_>::shrink_to_fit
                  ((vector<double,_std::allocator<double>_> *)0x1a9ece);
      }
      else {
        std::vector<ImputeNode,_std::allocator<ImputeNode>_>::operator[](in_RDI,local_20);
        shrink_impute_node((ImputeNode *)0x1a9e96);
      }
    }
  }
  std::vector<ImputeNode,_std::allocator<ImputeNode>_>::shrink_to_fit
            ((vector<ImputeNode,_std::allocator<ImputeNode>_> *)0x1a9f99);
  return;
}

Assistant:

void drop_nonterminal_imp_node(std::vector<ImputeNode>  &imputer_tree,
                               std::vector<IsoTree>     *trees,
                               std::vector<IsoHPlane>   *hplanes)
{
    if (trees != NULL)
    {
        for (size_t tr = 0; tr < trees->size(); tr++)
        {
            if ((*trees)[tr].tree_left != 0)
            {
                shrink_impute_node(imputer_tree[tr]);
            }

            else
            {
                /* cat_weight is not needed for anything else */
                imputer_tree[tr].cat_weight.clear();
                imputer_tree[tr].cat_weight.shrink_to_fit();
            }
        }
    }

    else
    {
        for (size_t tr = 0; tr < hplanes->size(); tr++)
        {
            if ((*hplanes)[tr].hplane_left != 0)
            {
                shrink_impute_node(imputer_tree[tr]);
            }

            else
            {
                /* cat_weight is not needed for anything else */
                imputer_tree[tr].cat_weight.clear();
                imputer_tree[tr].cat_weight.shrink_to_fit();
            }
        }
    }

    imputer_tree.shrink_to_fit();
}